

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O0

Type_Info *
chaiscript::boxed_cast<chaiscript::Type_Info_const&>
          (Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *pTVar2;
  Type_Conversions *pTVar3;
  Conversion_Saves *from;
  bad_boxed_cast *this;
  byte local_c1;
  byte local_b1;
  bad_any_cast *anon_var_0_1;
  undefined1 local_60 [24];
  bad_any_cast *anon_var_0;
  Type_Info local_38;
  Type_Conversions_State *local_20;
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *bv_local;
  
  local_b1 = 1;
  local_20 = t_conversions;
  t_conversions_local = (Type_Conversions_State *)bv;
  if (t_conversions != (Type_Conversions_State *)0x0) {
    pTVar2 = Boxed_Value::get_type_info(bv);
    user_type<chaiscript::Type_Info_const&>();
    bVar1 = Type_Info::bare_equal(pTVar2,&local_38);
    local_b1 = 1;
    if (!bVar1) {
      local_c1 = 0;
      if (local_20 != (Type_Conversions_State *)0x0) {
        pTVar3 = Type_Conversions_State::operator->(local_20);
        bVar1 = Type_Conversions::convertable_type<chaiscript::Type_Info_const&>(pTVar3);
        local_c1 = bVar1 ^ 0xff;
      }
      local_b1 = local_c1;
    }
  }
  if ((local_b1 & 1) == 0) {
    if (local_20 != (Type_Conversions_State *)0x0) {
      pTVar3 = Type_Conversions_State::operator->(local_20);
      bVar1 = Type_Conversions::convertable_type<chaiscript::Type_Info_const&>(pTVar3);
      if (bVar1) {
        pTVar3 = Type_Conversions_State::operator->(local_20);
        from = Type_Conversions_State::saves(local_20);
        Type_Conversions::boxed_type_conversion<chaiscript::Type_Info_const&>
                  ((Type_Conversions *)local_60,(Conversion_Saves *)pTVar3,(Boxed_Value *)from);
        bv_local = (Boxed_Value *)
                   detail::Cast_Helper<const_chaiscript::Type_Info_&>::cast
                             ((Boxed_Value *)local_60,local_20);
        Boxed_Value::~Boxed_Value((Boxed_Value *)local_60);
        return (Type_Info *)bv_local;
      }
    }
    this = (bad_boxed_cast *)__cxa_allocate_exception(0x38);
    pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)t_conversions_local);
    exception::bad_boxed_cast::bad_boxed_cast(this,*pTVar2,(type_info *)&Type_Info::typeinfo);
    __cxa_throw(this,&exception::bad_boxed_cast::typeinfo,exception::bad_boxed_cast::~bad_boxed_cast
               );
  }
  pTVar2 = detail::Cast_Helper<const_chaiscript::Type_Info_&>::cast
                     ((Boxed_Value *)t_conversions_local,local_20);
  return pTVar2;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }